

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_c14n(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing c14n : 3 of 4 functions ...\n");
  }
  iVar1 = test_xmlC14NDocDumpMemory();
  iVar2 = test_xmlC14NDocSave();
  iVar3 = test_xmlC14NDocSaveTo();
  iVar4 = test_xmlC14NExecute();
  uVar5 = iVar4 + iVar3 + iVar2 + iVar1;
  if (uVar5 != 0) {
    printf("Module c14n: %d errors\n",(ulong)uVar5);
  }
  return uVar5;
}

Assistant:

static int
test_c14n(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing c14n : 3 of 4 functions ...\n");
    test_ret += test_xmlC14NDocDumpMemory();
    test_ret += test_xmlC14NDocSave();
    test_ret += test_xmlC14NDocSaveTo();
    test_ret += test_xmlC14NExecute();

    if (test_ret != 0)
	printf("Module c14n: %d errors\n", test_ret);
    return(test_ret);
}